

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_operationset.c
# Opt level: O1

void FAudio_OPERATIONSET_QueueExitLoop(FAudioSourceVoice *voice,uint32_t OperationSet)

{
  FAudio *pFVar1;
  FAudio_OPERATIONSET_Operation *pFVar2;
  FAudio_OPERATIONSET_Operation *pFVar3;
  FAudio_OPERATIONSET_Operation **ppFVar4;
  FAudio_OPERATIONSET_Operation *pFVar5;
  
  FAudio_PlatformLockMutex(voice->audio->operationLock);
  pFVar3 = (FAudio_OPERATIONSET_Operation *)(*voice->audio->pMalloc)(0x30);
  pFVar3->Type = FAUDIOOP_EXITLOOP;
  pFVar3->Voice = voice;
  pFVar3->OperationSet = OperationSet;
  pFVar3->next = (FAudio_OPERATIONSET_Operation *)0x0;
  pFVar1 = voice->audio;
  pFVar2 = pFVar1->queuedOperations;
  if (pFVar1->queuedOperations == (FAudio_OPERATIONSET_Operation *)0x0) {
    ppFVar4 = &pFVar1->queuedOperations;
  }
  else {
    do {
      pFVar5 = pFVar2;
      pFVar2 = pFVar5->next;
    } while (pFVar2 != (FAudio_OPERATIONSET_Operation *)0x0);
    ppFVar4 = &pFVar5->next;
  }
  *ppFVar4 = pFVar3;
  FAudio_PlatformUnlockMutex(pFVar1->operationLock);
  return;
}

Assistant:

void FAudio_OPERATIONSET_QueueExitLoop(
	FAudioSourceVoice *voice,
	uint32_t OperationSet
) {
	FAudio_PlatformLockMutex(voice->audio->operationLock);
	LOG_MUTEX_LOCK(voice->audio, voice->audio->operationLock)

	QueueOperation(
		voice,
		FAUDIOOP_EXITLOOP,
		OperationSet
	);

	/* No special data for ExitLoop */

	FAudio_PlatformUnlockMutex(voice->audio->operationLock);
	LOG_MUTEX_UNLOCK(voice->audio, voice->audio->operationLock)
}